

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  Vec_Wec_t *__ptr;
  void *pvVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Hsh_IntMan_t *__ptr_00;
  Vec_Wrd_t *__ptr_01;
  word *__ptr_02;
  sat_solver *psVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  char **__ptr_03;
  ulong uVar9;
  long lVar10;
  
  if (p->pPars->fVerbose != 0) {
    psVar4 = p->pSat;
    uVar7 = (ulong)(uint)psVar4->size;
    if (psVar4->size < 1) {
      uVar9 = 0;
    }
    else {
      lVar6 = 0;
      uVar9 = 0;
      do {
        if (psVar4->pFreqs[lVar6] != '\0') {
          psVar4->pFreqs[lVar6] = '\0';
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar7 = (ulong)(uint)psVar4->size;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar7);
      psVar4 = p->pSat;
      uVar7 = (ulong)(uint)psVar4->size;
    }
    Abc_Print((int)uVar7,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)(int)uVar9 * 100.0) / (double)(int)uVar7,(ulong)(uint)psVar4->nLearntStart,
              (ulong)(uint)psVar4->nLearntDelta,(ulong)(uint)psVar4->nLearntRatio,
              (ulong)(uint)psVar4->nDBreduces,uVar7,uVar9);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmc3.c"
                    ,0x316,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  iVar5 = __ptr->nCap;
  pVVar8 = __ptr->pArray;
  if (iVar5 < 1) {
    if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_00512ca6;
  }
  else {
    lVar10 = 8;
    lVar6 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar8->nCap + lVar10);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar8 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar8->nCap + lVar10) = 0;
        iVar5 = __ptr->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar6 < iVar5);
LAB_00512ca6:
    free(pVVar8);
  }
  free(__ptr);
  pVVar8 = p->vMapping;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar8 = p->vMapRefs;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar8 = p->vId2Num;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar3 = p->vId2Var;
  iVar5 = pVVar3->nSize;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar6];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
        }
        free(pvVar1);
        iVar5 = pVVar3->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = p->vTerInfo;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar3->nSize;
    if (0 < iVar5) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar6]) {
          free(pVVar3->pArray[lVar6]);
          iVar5 = pVVar3->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar5);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  sat_solver_delete(p->pSat);
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar8 = p->vData;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  __ptr_00 = p->vHash;
  pVVar8 = __ptr_00->vTable;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  __ptr_01 = __ptr_00->vObjs;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (word *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  free(__ptr_00);
  pVVar8 = p->vId2Lit;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr_03 = p->pSops;
  if (__ptr_03[1] != (char *)0x0) {
    free(__ptr_03[1]);
    p->pSops[1] = (char *)0x0;
    __ptr_03 = p->pSops;
    if (__ptr_03 == (char **)0x0) goto LAB_00512e8e;
  }
  free(__ptr_03);
LAB_00512e8e:
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = sat_solver_count_usedvars(p->pSat);
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat->nLearntStart, p->pSat->nLearntDelta, p->pSat->nLearntRatio, 
            p->pSat->nDBreduces, p->pSat->size, nUsedVars, 100.0*nUsedVars/p->pSat->size );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    sat_solver_delete( p->pSat );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}